

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingScanPartial<unsigned_char,signed_char,unsigned_char>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  uint8_t *out;
  BitpackingMode BVar1;
  byte bVar2;
  uchar frame_of_reference;
  data_ptr_t pdVar3;
  BitpackingScanState<unsigned_char,_signed_char> *this;
  idx_t iVar4;
  size_t sVar5;
  idx_t remaining;
  ulong uVar6;
  uint uVar7;
  ulong __n;
  ulong uVar8;
  
  this = (BitpackingScanState<unsigned_char,_signed_char> *)
         unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
         operator->(&state->scan_state);
  pdVar3 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  for (uVar8 = 0; uVar6 = scan_count - uVar8, uVar8 <= scan_count && uVar6 != 0; uVar8 = uVar8 + __n
      ) {
    iVar4 = this->current_group_offset;
    if (iVar4 == 0x800) {
      BitpackingScanState<unsigned_char,_signed_char>::LoadNextGroup(this);
      iVar4 = this->current_group_offset;
    }
    BVar1 = (this->current_group).mode;
    if (BVar1 == CONSTANT_DELTA) {
      __n = 0x800 - iVar4;
      if (uVar6 < 0x800 - iVar4) {
        __n = uVar6;
      }
      for (uVar6 = 0; iVar4 = this->current_group_offset, __n != uVar6; uVar6 = uVar6 + 1) {
        pdVar3[uVar6 + uVar8 + result_offset] =
             this->current_constant * ((char)iVar4 + (char)uVar6) + this->current_frame_of_reference
        ;
      }
    }
    else {
      if (BVar1 == CONSTANT) {
        __n = 0x800 - iVar4;
        if (uVar6 < 0x800 - iVar4) {
          __n = uVar6;
        }
        switchD_014c3389::default(pdVar3 + uVar8 + result_offset,(uint)this->current_constant,uVar6)
        ;
      }
      else {
        uVar7 = (uint)iVar4 & 0x1f;
        __n = 0x20 - (ulong)uVar7;
        if (uVar6 < __n) {
          __n = uVar6;
        }
        bVar2 = this->current_width;
        out = pdVar3 + uVar8 + result_offset;
        if (__n == 0x20) {
          duckdb_fastpforlib::fastunpack
                    (this->current_group_ptr + ((bVar2 * iVar4 >> 3) - (ulong)(uVar7 * bVar2 >> 3)),
                     out,(uint)bVar2);
        }
        else {
          duckdb_fastpforlib::fastunpack
                    (this->current_group_ptr + ((bVar2 * iVar4 >> 3) - (ulong)(uVar7 * bVar2 >> 3)),
                     this->decompression_buffer,(uint)bVar2);
          switchD_01939fa4::default(out,this->decompression_buffer + uVar7,__n);
        }
        frame_of_reference = this->current_frame_of_reference;
        if ((this->current_group).mode == DELTA_FOR) {
          ApplyFrameOfReference<signed_char>((char *)out,frame_of_reference,__n);
          DeltaDecode<signed_char>((char *)out,this->current_delta_offset,__n);
          this->current_delta_offset = out[__n - 1];
        }
        else if (frame_of_reference != '\0') {
          for (sVar5 = 0; __n != sVar5; sVar5 = sVar5 + 1) {
            out[sVar5] = out[sVar5] + frame_of_reference;
          }
        }
      }
      iVar4 = this->current_group_offset;
    }
    this->current_group_offset = iVar4 + __n;
  }
  return;
}

Assistant:

void BitpackingScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                           idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<BitpackingScanState<T>>();

	T *result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	//! Because FOR offsets all our values to be 0 or above, we can always skip sign extension here
	bool skip_sign_extend = true;

	idx_t scanned = 0;
	while (scanned < scan_count) {
		D_ASSERT(scan_state.current_group_offset <= BITPACKING_METADATA_GROUP_SIZE);

		// Exhausted this metadata group, move pointers to next group and load metadata for next group.
		if (scan_state.current_group_offset == BITPACKING_METADATA_GROUP_SIZE) {
			scan_state.LoadNextGroup();
		}

		idx_t offset_in_compression_group =
		    scan_state.current_group_offset % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;

		if (scan_state.current_group.mode == BitpackingMode::CONSTANT) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *begin = result_data + result_offset + scanned;
			T *end = begin + remaining;
			std::fill(begin, end, scan_state.current_constant);
			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		if (scan_state.current_group.mode == BitpackingMode::CONSTANT_DELTA) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *target_ptr = result_data + result_offset + scanned;

			for (idx_t i = 0; i < to_scan; i++) {
				idx_t multiplier = scan_state.current_group_offset + i;
				// intended static casts to unsigned and back for defined wrapping of integers
				target_ptr[i] = static_cast<T>((static_cast<T_U>(scan_state.current_constant) * multiplier) +
				                               static_cast<T_U>(scan_state.current_frame_of_reference));
			}

			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		D_ASSERT(scan_state.current_group.mode == BitpackingMode::FOR ||
		         scan_state.current_group.mode == BitpackingMode::DELTA_FOR);

		idx_t to_scan = MinValue<idx_t>(scan_count - scanned, BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE -
		                                                          offset_in_compression_group);
		// Calculate start of compression algorithm group
		data_ptr_t current_position_ptr =
		    scan_state.current_group_ptr + scan_state.current_group_offset * scan_state.current_width / 8;
		data_ptr_t decompression_group_start_pointer =
		    current_position_ptr - offset_in_compression_group * scan_state.current_width / 8;

		T *current_result_ptr = result_data + result_offset + scanned;

		if (to_scan == BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE && offset_in_compression_group == 0) {
			// Decompress directly into result vector
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(current_result_ptr), decompression_group_start_pointer,
			                                     scan_state.current_width, skip_sign_extend);
		} else {
			// Decompress compression algorithm to buffer
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(scan_state.decompression_buffer),
			                                     decompression_group_start_pointer, scan_state.current_width,
			                                     skip_sign_extend);

			memcpy(current_result_ptr, scan_state.decompression_buffer + offset_in_compression_group,
			       to_scan * sizeof(T));
		}

		if (scan_state.current_group.mode == BitpackingMode::DELTA_FOR) {
			ApplyFrameOfReference<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                           static_cast<T_S>(scan_state.current_frame_of_reference), to_scan);
			DeltaDecode<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                 static_cast<T_S>(scan_state.current_delta_offset), to_scan);
			scan_state.current_delta_offset = current_result_ptr[to_scan - 1];
		} else {
			ApplyFrameOfReference<T>(current_result_ptr, scan_state.current_frame_of_reference, to_scan);
		}

		scanned += to_scan;
		scan_state.current_group_offset += to_scan;
	}
}